

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

OP2instrEntry * __thiscall musicBlock::getInstrument(musicBlock *this,uint channel,uchar note)

{
  uint local_24;
  uint instrnumber;
  uchar note_local;
  uint channel_local;
  musicBlock *this_local;
  
  if (channel == 0xf) {
    if ((note < 0x23) || (0x51 < note)) {
      return (OP2instrEntry *)0x0;
    }
    local_24 = note + 0x5d;
  }
  else {
    local_24 = (this->driverdata).channelInstr[channel];
  }
  if (this->OPLinstruments == (OP2instrEntry *)0x0) {
    this_local = (musicBlock *)0x0;
  }
  else {
    this_local = (musicBlock *)(this->OPLinstruments + local_24);
  }
  return (OP2instrEntry *)this_local;
}

Assistant:

struct OP2instrEntry *musicBlock::getInstrument(uint channel, uchar note)
{
	uint instrnumber;

	if (channel == PERCUSSION)
	{
		if (note < 35 || note > 81)
			return NULL;		/* wrong percussion number */
		instrnumber = note + (128-35);
	}
	else
	{
		instrnumber = driverdata.channelInstr[channel];
	}

	if (OPLinstruments)
		return &OPLinstruments[instrnumber];
	else
		return NULL;
}